

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

Iterator * __thiscall leveldb::VersionSet::MakeInputIterator(VersionSet *this,Compaction *c)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar1;
  bool bVar2;
  Iterator **children;
  Iterator *pIVar3;
  long lVar4;
  pointer ppFVar5;
  int n;
  ulong uVar6;
  bool bVar7;
  long in_FS_OFFSET;
  uint local_70;
  ReadOptions local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.snapshot = (Snapshot *)0x0;
  local_48.verify_checksums = this->options_->paranoid_checks;
  local_48.fill_cache = false;
  if (c->level_ == 0) {
    local_70 = (int)((ulong)((long)c->inputs_[0].
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)c->inputs_[0].
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
    uVar6 = 0xffffffffffffffff;
    if (-1 < (int)local_70) {
      uVar6 = (ulong)local_70 * 8;
    }
  }
  else {
    local_70 = 2;
    uVar6 = 0x10;
  }
  children = (Iterator **)operator_new__(uVar6);
  lVar4 = 0;
  n = 0;
  bVar2 = true;
  do {
    bVar7 = bVar2;
    ppFVar5 = c->inputs_[lVar4].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppFVar5 !=
        c->inputs_[lVar4].
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pvVar1 = c->inputs_ + lVar4;
      if ((int)lVar4 + c->level_ == 0) {
        uVar6 = 0;
        do {
          pIVar3 = TableCache::NewIterator
                             (this->table_cache_,&local_48,ppFVar5[uVar6]->number,
                              ppFVar5[uVar6]->file_size,(Table **)0x0);
          children[(long)n + uVar6] = pIVar3;
          uVar6 = uVar6 + 1;
          ppFVar5 = (pvVar1->
                    super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                    )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar6 < (ulong)((long)(pvVar1->
                                       super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5
                                >> 3));
        n = n + (int)uVar6;
      }
      else {
        pIVar3 = (Iterator *)operator_new(0x58);
        Iterator::Iterator(pIVar3);
        pIVar3->_vptr_Iterator = (_func_int **)&PTR__LevelFileNumIterator_01397640;
        pIVar3[1]._vptr_Iterator = (_func_int **)&PTR__Comparator_013974e0;
        pIVar3[1].cleanup_head_.function = (CleanupFunction)(this->icmp_).user_comparator_;
        pIVar3[1].cleanup_head_.arg1 = pvVar1;
        *(int *)&pIVar3[1].cleanup_head_.arg2 =
             (int)((ulong)((long)(pvVar1->
                                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar1->
                                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3);
        pIVar3 = NewTwoLevelIterator(pIVar3,GetFileIterator,this->table_cache_,&local_48);
        lVar4 = (long)n;
        n = n + 1;
        children[lVar4] = pIVar3;
      }
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar7);
  if (n <= (int)local_70) {
    pIVar3 = NewMergingIterator(&(this->icmp_).super_Comparator,children,n);
    operator_delete__(children);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return pIVar3;
    }
    __stack_chk_fail();
  }
  __assert_fail("num <= space",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x4d9,"Iterator *leveldb::VersionSet::MakeInputIterator(Compaction *)");
}

Assistant:

Iterator* VersionSet::MakeInputIterator(Compaction* c) {
  ReadOptions options;
  options.verify_checksums = options_->paranoid_checks;
  options.fill_cache = false;

  // Level-0 files have to be merged together.  For other levels,
  // we will make a concatenating iterator per level.
  // TODO(opt): use concatenating iterator for level-0 if there is no overlap
  const int space = (c->level() == 0 ? c->inputs_[0].size() + 1 : 2);
  Iterator** list = new Iterator*[space];
  int num = 0;
  for (int which = 0; which < 2; which++) {
    if (!c->inputs_[which].empty()) {
      if (c->level() + which == 0) {
        const std::vector<FileMetaData*>& files = c->inputs_[which];
        for (size_t i = 0; i < files.size(); i++) {
          list[num++] = table_cache_->NewIterator(options, files[i]->number,
                                                  files[i]->file_size);
        }
      } else {
        // Create concatenating iterator for the files from this level
        list[num++] = NewTwoLevelIterator(
            new Version::LevelFileNumIterator(icmp_, &c->inputs_[which]),
            &GetFileIterator, table_cache_, options);
      }
    }
  }
  assert(num <= space);
  Iterator* result = NewMergingIterator(&icmp_, list, num);
  delete[] list;
  return result;
}